

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O1

shared_ptr<duckdb::Relation,_true> __thiscall
duckdb::Connection::Table
          (Connection *this,string *catalog_name,string *schema_name,string *table_name)

{
  _Head_base<0UL,_duckdb::TableDescription_*,_false> _Var1;
  undefined8 uVar2;
  ClientContext *pCVar3;
  CatalogException *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  pointer *__ptr;
  string *in_R8;
  shared_ptr<duckdb::Relation,_true> sVar5;
  unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
  table_info;
  _Head_base<0UL,_duckdb::TableDescription_*,_false> local_98;
  undefined1 local_89;
  undefined1 local_88 [24];
  undefined1 local_70 [32];
  string local_50;
  
  local_98._M_head_impl = (TableDescription *)0x0;
  pCVar3 = shared_ptr<duckdb::ClientContext,_true>::operator->
                     ((shared_ptr<duckdb::ClientContext,_true> *)catalog_name);
  ClientContext::TableInfo((ClientContext *)local_70,(string *)pCVar3,schema_name,table_name);
  uVar2 = local_70._0_8_;
  _Var1._M_head_impl = local_98._M_head_impl;
  local_70._0_8_ = (element_type *)0x0;
  local_98._M_head_impl = (TableDescription *)uVar2;
  if (_Var1._M_head_impl != (TableDescription *)0x0) {
    ::std::default_delete<duckdb::TableDescription>::operator()
              ((default_delete<duckdb::TableDescription> *)&local_98,_Var1._M_head_impl);
  }
  if ((element_type *)local_70._0_8_ != (element_type *)0x0) {
    ::std::default_delete<duckdb::TableDescription>::operator()
              ((default_delete<duckdb::TableDescription> *)local_70,
               (TableDescription *)local_70._0_8_);
  }
  if ((((element_type *)local_98._M_head_impl == (element_type *)0x0) &&
      (schema_name->_M_string_length == 0)) && (table_name->_M_string_length != 0)) {
    local_70._0_8_ = (element_type *)(local_70 + 0x10);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"main","");
    pCVar3 = shared_ptr<duckdb::ClientContext,_true>::operator->
                       ((shared_ptr<duckdb::ClientContext,_true> *)catalog_name);
    ClientContext::TableInfo
              ((ClientContext *)local_88,(string *)pCVar3,table_name,(string *)local_70);
    uVar2 = local_88._0_8_;
    _Var1._M_head_impl = local_98._M_head_impl;
    local_88._0_8_ = (element_type *)0x0;
    local_98._M_head_impl = (TableDescription *)uVar2;
    if ((element_type *)_Var1._M_head_impl != (element_type *)0x0) {
      ::std::default_delete<duckdb::TableDescription>::operator()
                ((default_delete<duckdb::TableDescription> *)&local_98,_Var1._M_head_impl);
    }
    if ((element_type *)local_88._0_8_ != (element_type *)0x0) {
      ::std::default_delete<duckdb::TableDescription>::operator()
                ((default_delete<duckdb::TableDescription> *)local_88,
                 (TableDescription *)local_88._0_8_);
    }
    local_88._0_8_ = (element_type *)0x0;
    if ((element_type *)local_70._0_8_ != (element_type *)(local_70 + 0x10)) {
      operator_delete((void *)local_70._0_8_);
    }
  }
  if ((element_type *)local_98._M_head_impl != (element_type *)0x0) {
    local_70._0_8_ = (element_type *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<duckdb::TableRelation,std::allocator<duckdb::TableRelation>,duckdb::shared_ptr<duckdb::ClientContext,true>&,duckdb::unique_ptr<duckdb::TableDescription,std::default_delete<duckdb::TableDescription>,true>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8),
               (TableRelation **)local_70,(allocator<duckdb::TableRelation> *)&local_89,
               (shared_ptr<duckdb::ClientContext,_true> *)catalog_name,
               (unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
                *)&local_98);
    shared_ptr<duckdb::TableRelation,_true>::shared_ptr
              ((shared_ptr<duckdb::TableRelation,_true> *)local_88,
               (shared_ptr<duckdb::TableRelation> *)local_70);
    _Var4._M_pi = extraout_RDX;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
      _Var4._M_pi = extraout_RDX_00;
    }
    uVar2 = local_88._8_8_;
    (this->context).internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_88._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->context).internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)local_88._0_8_;
    (this->context).internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
    if ((element_type *)local_98._M_head_impl != (element_type *)0x0) {
      ::std::default_delete<duckdb::TableDescription>::operator()
                ((default_delete<duckdb::TableDescription> *)&local_98,local_98._M_head_impl);
      _Var4._M_pi = extraout_RDX_01;
    }
    sVar5.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Var4._M_pi;
    sVar5.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<duckdb::Relation,_true>)
           sVar5.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (CatalogException *)__cxa_allocate_exception(0x10);
  local_70._0_8_ = local_70 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"Table %s does not exist!","");
  ParseInfo::QualifierToString(&local_50,schema_name,table_name,in_R8);
  CatalogException::CatalogException<std::__cxx11::string>(this_00,(string *)local_70,&local_50);
  __cxa_throw(this_00,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

shared_ptr<Relation> Connection::Table(const string &catalog_name, const string &schema_name,
                                       const string &table_name) {
	unique_ptr<TableDescription> table_info;
	do {
		table_info = TableInfo(catalog_name, schema_name, table_name);
		if (table_info) {
			break;
		}

		if (catalog_name.empty() && !schema_name.empty()) {
			table_info = TableInfo(schema_name, DEFAULT_SCHEMA, table_name);
		}
	} while (false);

	if (!table_info) {
		throw CatalogException("Table %s does not exist!",
		                       ParseInfo::QualifierToString(catalog_name, schema_name, table_name));
	}
	return make_shared_ptr<TableRelation>(context, std::move(table_info));
}